

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Expression>_>::truncate
          (ArrayBuilder<capnp::Orphan<capnp::compiler::Expression>_> *this,char *__file,
          __off_t __length)

{
  Orphan<capnp::compiler::Expression> *pOVar1;
  Orphan<capnp::compiler::Expression> *pOVar2;
  
  pOVar1 = this->ptr;
  pOVar2 = this->pos;
  while (pOVar1 + (long)__file < pOVar2) {
    this->pos = (RemoveConst<capnp::Orphan<capnp::compiler::Expression>_> *)&pOVar2[-1].builder;
    if (pOVar2[-1].builder.segment != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize(&pOVar2[-1].builder);
    }
    pOVar2 = this->pos;
  }
  return (int)pOVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }